

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_loop_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,int plane_start,
               int plane_end,int partial_frame,AVxWorker *workers,int num_workers,AV1LfSync *lf_sync
               ,int lpf_opt_level)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  LFWorkerData *pLVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  AV1_COMMON *cm_00;
  YV12_BUFFER_CONFIG *frame_buffer;
  int iVar9;
  AV1LfMTInfo *pAVar10;
  AVxWorkerInterface *pAVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  AVxWorker *worker;
  AVxWorker *pAVar21;
  bool bVar22;
  TX_SIZE tx_buf [32];
  aom_internal_error_info error_info;
  aom_internal_error_info *in_stack_fffffffffffffd40;
  uint local_28c [3];
  AV1_COMMON *local_280;
  int local_274;
  AVxWorkerInterface *local_270;
  YV12_BUFFER_CONFIG *local_268;
  ulong local_260;
  TX_SIZE local_258 [32];
  aom_internal_error_info local_238;
  
  if ((cm->lf).filter_level[0] == 0) {
    local_28c[0] = 0;
    if ((0 < plane_start) || ((cm->lf).filter_level[1] == 0)) goto LAB_00bc7381;
  }
  else {
    local_28c[0] = 0;
    if (0 < plane_start) goto LAB_00bc7381;
  }
  local_28c[0] = (uint)(0 < plane_end);
LAB_00bc7381:
  uVar3 = (cm->lf).filter_level_u;
  uVar4 = (cm->lf).filter_level_v;
  uVar17 = ~-(uint)(uVar3 == 0 || 1 < plane_start) & -(uint)(1 < plane_end);
  uVar13 = ~-(uint)(uVar4 == 0 || 2 < plane_start) & -(uint)(2 < plane_end);
  local_28c[1] = uVar17 & 1;
  local_28c[2] = uVar13 & 1;
  if ((byte)((plane_end < 1 || 0 < plane_start) | (byte)local_28c[0]) == 1) {
    local_270 = (AVxWorkerInterface *)CONCAT44(local_270._4_4_,uVar17);
    if ((((byte)uVar13 | (byte)local_28c[0] | (byte)uVar17) & 1) != 0) {
      uVar17 = (cm->mi_params).mi_rows;
      uVar19 = (ulong)uVar17;
      if ((int)uVar17 < 9 || partial_frame == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = uVar17 >> 1 & 0x3ffffff8;
        uVar19 = 8;
        if (0x47 < uVar17) {
          uVar19 = (ulong)(uVar17 >> 3);
        }
      }
      local_274 = uVar13 + (int)uVar19;
      local_268 = frame;
      av1_loop_filter_frame_init(cm,plane_start,plane_end);
      local_280 = cm;
      if (num_workers < 2) {
        if (0 < (int)uVar19) {
          do {
            lVar20 = 0;
            do {
              frame_buffer = local_268;
              cm_00 = local_280;
              iVar15 = (int)lVar20;
              if (lpf_opt_level == 2) {
                puVar12 = local_28c;
                if (iVar15 == 0) goto LAB_00bc77c2;
                if (iVar15 != 2) {
                  if (iVar15 != 1) goto LAB_00bc77ab;
                  puVar12 = local_28c + 2;
                  if (((ulong)local_270 & 1) == 0) goto LAB_00bc77c2;
                  goto LAB_00bc77c7;
                }
              }
              else {
LAB_00bc77ab:
                puVar12 = local_28c + lVar20;
LAB_00bc77c2:
                if (*puVar12 != 0) {
LAB_00bc77c7:
                  iVar9 = 0;
                  do {
                    av1_thread_loop_filter_rows
                              (frame_buffer,cm_00,xd->plane,xd,uVar13,iVar15,iVar9,lpf_opt_level,
                               (AV1LfSync *)0x0,in_stack_fffffffffffffd40,
                               (AV1_DEBLOCKING_PARAMETERS *)&local_238,local_258,5);
                    iVar9 = iVar9 + 1;
                  } while (iVar9 == 1);
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
            uVar13 = uVar13 + 0x20;
          } while ((int)uVar13 < local_274);
        }
      }
      else {
        local_260 = uVar19;
        local_270 = aom_get_worker_interface();
        iVar15 = (cm->mi_params).mi_rows + 0x1f >> 5;
        if (((lf_sync->sync_range == 0) || (iVar15 != lf_sync->rows)) ||
           (lf_sync->num_workers < num_workers)) {
          av1_loop_filter_dealloc(lf_sync);
          av1_loop_filter_alloc(lf_sync,cm,iVar15,cm->width,num_workers);
        }
        lf_sync->lf_mt_exit = false;
        lVar20 = 6;
        do {
          memset(lf_sync->mutex_[lVar20],0xff,(long)iVar15 << 2);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 9);
        pAVar10 = lf_sync->job_queue;
        lf_sync->jobs_enqueued = 0;
        lf_sync->jobs_dequeued = 0;
        iVar15 = 0;
        do {
          uVar17 = uVar13;
          if (0 < (int)local_260) {
            do {
              lVar20 = 0;
              lVar18 = 0;
              do {
                iVar9 = (int)lVar18;
                if (lpf_opt_level != 2) {
LAB_00bc7564:
                  puVar12 = (uint *)((long)local_28c + lVar20);
                  goto LAB_00bc756c;
                }
                if (iVar9 != 2) {
                  if (iVar9 == 1) {
                    puVar12 = local_28c + 2;
                    if (local_28c[1] == 0) goto LAB_00bc756c;
                  }
                  else {
                    puVar12 = local_28c;
                    if (iVar9 != 0) goto LAB_00bc7564;
LAB_00bc756c:
                    if (*puVar12 == 0) goto LAB_00bc758f;
                  }
                  if (local_28c[lVar18] != 0) {
                    pAVar10->mi_row = uVar17;
                    pAVar10->plane = iVar9;
                    pAVar10->dir = iVar15;
                    pAVar10->lpf_opt_level = lpf_opt_level;
                    pAVar10 = pAVar10 + 1;
                    lf_sync->jobs_enqueued = lf_sync->jobs_enqueued + 1;
                  }
                }
LAB_00bc758f:
                lVar18 = lVar18 + 1;
                lVar20 = lVar20 + 4;
              } while (lVar18 != 3);
              uVar17 = uVar17 + 0x20;
            } while ((int)uVar17 < local_274);
          }
          bVar22 = iVar15 == 0;
          iVar15 = iVar15 + 1;
        } while (bVar22);
        uVar14 = (ulong)(uint)num_workers;
        lVar20 = uVar14 * 0x2268 + -0x2248;
        uVar19 = uVar14;
        do {
          uVar16 = uVar19 - 1;
          pAVar21 = workers + uVar16;
          pLVar5 = lf_sync->lfdata;
          workers[uVar16].hook = loop_filter_row_worker;
          workers[uVar16].data1 = lf_sync;
          workers[uVar16].data2 = pLVar5 + uVar16;
          pLVar5[uVar16].frame_buffer = local_268;
          pLVar5[uVar16].cm = local_280;
          pLVar5[uVar16].xd = xd;
          lVar18 = 0;
          do {
            puVar1 = (undefined8 *)((long)&xd->plane[0].pre[-1].buf + lVar18);
            uVar6 = *puVar1;
            uVar7 = puVar1[1];
            puVar1 = (undefined8 *)((long)xd->plane[0].pre + lVar18 + -0x10);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pLVar5->planes[0].pre + lVar18 + lVar20 + -0x30);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)(pLVar5->planes[0].pre + -2) + lVar18 + lVar20);
            *puVar1 = uVar6;
            puVar1[1] = uVar7;
            *(undefined8 *)((long)pLVar5->planes[0].pre + lVar18 + lVar20 + -0x4c) =
                 *(undefined8 *)((long)xd->plane[0].pre + lVar18 + -0x2c);
            lVar18 = lVar18 + 0xa30;
          } while (lVar18 != 0x1e90);
          pAVar21->had_error = 0;
          if (uVar16 == 0) {
            (*local_270->execute)(pAVar21);
          }
          else {
            (*local_270->launch)(pAVar21);
          }
          lVar20 = lVar20 + -0x2268;
          bVar22 = 1 < (long)uVar19;
          uVar19 = uVar16;
        } while (bVar22);
        pAVar11 = aom_get_worker_interface();
        iVar15 = workers->had_error;
        if (iVar15 != 0) {
          memcpy(&local_238,(void *)((long)workers->data2 + 0x20c8),0x1a0);
        }
        lVar20 = uVar14 + 1;
        pAVar21 = workers + uVar14;
        do {
          iVar9 = (*pAVar11->sync)(pAVar21 + -1);
          if (iVar9 == 0) {
            memcpy(&local_238,(void *)((long)pAVar21[-1].data2 + 0x20c8),0x1a0);
            iVar15 = 1;
          }
          lVar20 = lVar20 + -1;
          pAVar21 = pAVar21 + -1;
        } while (2 < lVar20);
        if (iVar15 != 0) {
          aom_internal_error_copy(local_280->error,&local_238);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_loop_filter_frame_mt(YV12_BUFFER_CONFIG *frame, AV1_COMMON *cm,
                              MACROBLOCKD *xd, int plane_start, int plane_end,
                              int partial_frame, AVxWorker *workers,
                              int num_workers, AV1LfSync *lf_sync,
                              int lpf_opt_level) {
  int start_mi_row, end_mi_row, mi_rows_to_filter;
  int planes_to_lf[MAX_MB_PLANE];

  if (!check_planes_to_loop_filter(&cm->lf, planes_to_lf, plane_start,
                                   plane_end))
    return;

  start_mi_row = 0;
  mi_rows_to_filter = cm->mi_params.mi_rows;
  if (partial_frame && cm->mi_params.mi_rows > 8) {
    start_mi_row = cm->mi_params.mi_rows >> 1;
    start_mi_row &= 0xfffffff8;
    mi_rows_to_filter = AOMMAX(cm->mi_params.mi_rows / 8, 8);
  }
  end_mi_row = start_mi_row + mi_rows_to_filter;
  av1_loop_filter_frame_init(cm, plane_start, plane_end);

  if (num_workers > 1) {
    // Enqueue and execute loopfiltering jobs.
    loop_filter_rows_mt(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                        workers, num_workers, lf_sync, lpf_opt_level);
  } else {
    // Directly filter in the main thread.
    loop_filter_rows(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                     lpf_opt_level);
  }
}